

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_stream.c
# Opt level: O0

void unlink_sib(nghttp2_stream *stream)

{
  nghttp2_stream *pnVar1;
  nghttp2_stream *pnVar2;
  nghttp2_stream *dep_next;
  nghttp2_stream *next;
  nghttp2_stream *prev;
  nghttp2_stream *stream_local;
  
  pnVar2 = stream->sib_prev;
  pnVar1 = stream->dep_next;
  if (pnVar2 == (nghttp2_stream *)0x0) {
    __assert_fail("prev",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_stream.c"
                  ,0x2ad,"void unlink_sib(nghttp2_stream *)");
  }
  if (pnVar1 == (nghttp2_stream *)0x0) {
    pnVar1 = stream->sib_next;
    pnVar2->sib_next = pnVar1;
    if (pnVar1 != (nghttp2_stream *)0x0) {
      pnVar1->sib_prev = pnVar2;
    }
  }
  else {
    link_sib(pnVar2,pnVar1);
    set_dep_prev(pnVar1,stream->dep_prev);
    if (stream->sib_next != (nghttp2_stream *)0x0) {
      pnVar2 = stream_last_sib(pnVar1);
      link_sib(pnVar2,stream->sib_next);
    }
  }
  return;
}

Assistant:

static void unlink_sib(nghttp2_stream *stream) {
  nghttp2_stream *prev, *next, *dep_next;

  prev = stream->sib_prev;
  dep_next = stream->dep_next;

  assert(prev);

  if (dep_next) {
    /*
     *  prev--stream(--sib_next--...)
     *         |
     *        dep_next
     */

    link_sib(prev, dep_next);

    set_dep_prev(dep_next, stream->dep_prev);

    if (stream->sib_next) {
      link_sib(stream_last_sib(dep_next), stream->sib_next);
    }
  } else {
    /*
     *  prev--stream(--sib_next--...)
     */
    next = stream->sib_next;

    prev->sib_next = next;

    if (next) {
      next->sib_prev = prev;
    }
  }
}